

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

double mathiu::impl::log(double __x)

{
  shared_ptr<const_mathiu::impl::Expr> *in_RDX;
  shared_ptr<const_mathiu::impl::Expr> *in_RSI;
  Log *in_RDI;
  double extraout_XMM0_Qa;
  Log local_40;
  shared_ptr<const_mathiu::impl::Expr> *local_20;
  ExprPtr *rhs_local;
  ExprPtr *lhs_local;
  
  local_20 = in_RDX;
  std::shared_ptr<const_mathiu::impl::Expr>::shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&local_40,in_RSI);
  std::shared_ptr<const_mathiu::impl::Expr>::shared_ptr
            (local_40.super_ExprPtrArray<2>._M_elems + 1,local_20);
  makeSharedExprPtr<mathiu::impl::Log>(in_RDI);
  Log::~Log(&local_40);
  return extraout_XMM0_Qa;
}

Assistant:

inline ExprPtr log(ExprPtr const &lhs, ExprPtr const &rhs)
        {
            return makeSharedExprPtr(Log{{lhs, rhs}});
        }